

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Node<QObject_const*,QList<QCss::StyleRule>>::emplaceValue<QList<QCss::StyleRule>>
          (Node<QObject_const*,QList<QCss::StyleRule>> *this,QList<QCss::StyleRule> *args)

{
  Data *pDVar1;
  StyleRule *pSVar2;
  qsizetype qVar3;
  QTypedArrayData<QCss::StyleRule> *__old_val;
  longlong __old_val_1;
  long in_FS_OFFSET;
  QArrayDataPointer<QCss::StyleRule> local_40;
  QArrayDataPointer<QCss::StyleRule> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (args->d).d;
  (args->d).d = (Data *)0x0;
  pSVar2 = (args->d).ptr;
  (args->d).ptr = (StyleRule *)0x0;
  qVar3 = (args->d).size;
  (args->d).size = 0;
  local_40.d = (Data *)0x0;
  local_40.ptr = (StyleRule *)0x0;
  local_40.size = 0;
  local_28.d = *(Data **)(this + 8);
  local_28.ptr = *(StyleRule **)(this + 0x10);
  *(Data **)(this + 8) = pDVar1;
  *(StyleRule **)(this + 0x10) = pSVar2;
  local_28.size = *(qsizetype *)(this + 0x18);
  *(qsizetype *)(this + 0x18) = qVar3;
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_28);
  QArrayDataPointer<QCss::StyleRule>::~QArrayDataPointer(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }